

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utest.cpp
# Opt level: O1

void __thiscall
UtestShell::assertCstrNoCaseEqual
          (UtestShell *this,char *expected,char *actual,char *text,char *fileName,size_t lineNumber)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  SimpleString local_b8;
  char *local_a8;
  size_t local_a0;
  TestFailure local_98;
  TestResult *pTVar3;
  
  pTVar3 = testResult_;
  local_a8 = fileName;
  local_a0 = lineNumber;
  if (testResult_ == (TestResult *)0x0) {
    OutsideTestRunnerUTest::instance();
    iVar2 = (*OutsideTestRunnerUTest::instance::instance_.super_UtestShell._vptr_UtestShell[0x29])
                      (&OutsideTestRunnerUTest::instance::instance_);
    pTVar3 = (TestResult *)CONCAT44(extraout_var,iVar2);
  }
  (*pTVar3->_vptr_TestResult[10])();
  if (expected != (char *)0x0 || actual != (char *)0x0) {
    if (expected == (char *)0x0 || actual == (char *)0x0) {
      SimpleString::SimpleString(&local_b8,text);
      StringEqualNoCaseFailure::StringEqualNoCaseFailure
                ((StringEqualNoCaseFailure *)&local_98,this,local_a8,local_a0,expected,actual,
                 &local_b8);
      (*this->_vptr_UtestShell[0x26])(this,&local_98);
      TestFailure::~TestFailure(&local_98);
      SimpleString::~SimpleString(&local_b8);
    }
    SimpleString::SimpleString((SimpleString *)&local_98,expected);
    SimpleString::SimpleString(&local_b8,actual);
    bVar1 = SimpleString::equalsNoCase((SimpleString *)&local_98,&local_b8);
    SimpleString::~SimpleString(&local_b8);
    SimpleString::~SimpleString((SimpleString *)&local_98);
    if (!bVar1) {
      SimpleString::SimpleString(&local_b8,text);
      StringEqualNoCaseFailure::StringEqualNoCaseFailure
                ((StringEqualNoCaseFailure *)&local_98,this,local_a8,local_a0,expected,actual,
                 &local_b8);
      (*this->_vptr_UtestShell[0x26])(this,&local_98);
      TestFailure::~TestFailure(&local_98);
      SimpleString::~SimpleString(&local_b8);
    }
  }
  return;
}

Assistant:

void UtestShell::assertCstrNoCaseEqual(const char* expected, const char* actual, const char* text, const char* fileName, size_t lineNumber)
{
    getTestResult()->countCheck();
    if (actual == NULLPTR && expected == NULLPTR) return;
    if (actual == NULLPTR || expected == NULLPTR)
        failWith(StringEqualNoCaseFailure(this, fileName, lineNumber, expected, actual, text));
    if (!SimpleString(expected).equalsNoCase(actual))
        failWith(StringEqualNoCaseFailure(this, fileName, lineNumber, expected, actual, text));
}